

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableVector.h
# Opt level: O1

GeometryData * __thiscall
Rml::StableVector<Rml::RenderManager::GeometryData>::erase
          (GeometryData *__return_storage_ptr__,StableVector<Rml::RenderManager::GeometryData> *this
          ,StableVectorIndex index)

{
  ulong *puVar1;
  Vector<int> *pVVar2;
  pointer pGVar3;
  code *pcVar4;
  bool bVar5;
  ulong uVar6;
  GeometryData *__old_val;
  ulong uVar7;
  void *pvStack_40;
  undefined8 local_38;
  long lStack_30;
  pointer local_28;
  
  uVar7 = (ulong)index;
  uVar6 = ((long)(this->elements).
                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->elements).
                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if (((uVar6 < uVar7 || uVar6 - uVar7 == 0) ||
      (((this->free_slots).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[index >> 6] >>
        (uVar7 & 0x3f) & 1) != 0)) &&
     (bVar5 = Assert("RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)])",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/StableVector.h"
                     ,0x5d), !bVar5)) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  puVar1 = (this->free_slots).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (index >> 6);
  *puVar1 = *puVar1 | 1L << ((byte)index & 0x3f);
  pGVar3 = (this->elements).
           super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_28 = (pointer)0x0;
  local_38 = 0;
  lStack_30 = 0;
  pvStack_40 = (void *)0x0;
  pVVar2 = &pGVar3[uVar7].mesh.indices;
  (__return_storage_ptr__->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(((_Vector_base<int,_std::allocator<int>_> *)
                       &((Mesh *)(pVVar2 + -1))->vertices)->_M_impl).super__Vector_impl_data.
                      _M_start;
  (__return_storage_ptr__->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(((_Vector_base<int,_std::allocator<int>_> *)
                        &((Mesh *)(pVVar2 + -1))->vertices)->_M_impl).super__Vector_impl_data.
                       _M_finish;
  (__return_storage_ptr__->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(((_Vector_base<int,_std::allocator<int>_> *)&((Mesh *)(pVVar2 + -1))->vertices)->
                _M_impl).super__Vector_impl_data._M_end_of_storage;
  (((_Vector_base<int,_std::allocator<int>_> *)&((Mesh *)(pVVar2 + -1))->vertices)->_M_impl).
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((_Vector_base<int,_std::allocator<int>_> *)&((Mesh *)(pVVar2 + -1))->vertices)->_M_impl).
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<int,_std::allocator<int>_> *)&((Mesh *)(pVVar2 + -1))->vertices)->_M_impl).
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pVVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pVVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pVVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (pVVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pVVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pVVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __return_storage_ptr__->handle =
       (CompiledGeometryHandle)
       pVVar2[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::_M_move_assign
            ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)(pGVar3 + uVar7));
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign(pVVar2,&pvStack_40);
  pVVar2[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_28;
  if (pvStack_40 != (void *)0x0) {
    operator_delete(pvStack_40,lStack_30 - (long)pvStack_40);
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(StableVectorIndex index)
	{
		RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)]);
		free_slots[size_t(index)] = true;
		return std::exchange(elements[size_t(index)], T());
	}